

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O2

llm_graph_result_ptr __thiscall
llama_context::build_kv_self_defrag(llama_context *this,ggml_context *ctx0,ggml_cgraph *gf)

{
  llama_hparams *this_00;
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined4 *puVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 in_RCX;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint32_t il;
  ulong local_88;
  llama_model *local_68;
  
  std::make_unique<llm_graph_result>();
  lVar2 = *(long *)ctx0;
  this_00 = (llama_hparams *)(lVar2 + 0x28);
  lVar3 = *(long *)(ctx0 + 0x220);
  uVar15 = 0;
  while( true ) {
    lVar4 = *(long *)(lVar3 + 8);
    uVar13 = *(long *)(lVar3 + 0x10) - lVar4 >> 2;
    if (uVar13 <= uVar15) break;
    uVar1 = *(uint *)(lVar4 + uVar15 * 4);
    uVar17 = (ulong)uVar1;
    local_88 = uVar15;
    if (((uint)uVar15 != uVar1) && (uVar13 != uVar17)) {
      iVar14 = 1;
      while( true ) {
        uVar16 = (ulong)((int)local_88 + 1);
        if ((uVar13 <= uVar16) || (uVar1 + iVar14 != *(int *)(lVar4 + uVar16 * 4))) break;
        iVar14 = iVar14 + 1;
        local_88 = uVar16;
      }
      for (uVar13 = 0; uVar13 < *(uint *)(lVar2 + 0x38); uVar13 = uVar13 + 1) {
        uVar6 = llama_hparams::n_embd_k_gqa(this_00,(uint32_t)uVar13);
        uVar7 = llama_hparams::n_embd_v_gqa(this_00,(uint32_t)uVar13);
        uVar16 = (ulong)uVar6;
        puVar5 = *(undefined4 **)(*(long *)(*(long *)(ctx0 + 0x220) + 0x90) + uVar13 * 8);
        uVar8 = ggml_row_size(*puVar5,uVar16);
        uVar9 = ggml_row_size(**(undefined4 **)
                                (*(long *)(*(long *)(ctx0 + 0x220) + 0x90) + uVar13 * 8),
                              uVar16 * uVar15);
        uVar8 = ggml_view_2d(gf,puVar5,uVar16,iVar14,uVar8,uVar9);
        puVar5 = *(undefined4 **)(*(long *)(*(long *)(ctx0 + 0x220) + 0x90) + uVar13 * 8);
        uVar9 = ggml_row_size(*puVar5,uVar16);
        uVar10 = ggml_row_size(**(undefined4 **)
                                 (*(long *)(*(long *)(ctx0 + 0x220) + 0x90) + uVar13 * 8),
                               uVar16 * uVar17);
        uVar9 = ggml_view_2d(gf,puVar5,uVar16,iVar14,uVar9,uVar10);
        uVar16 = (ulong)uVar7;
        puVar5 = *(undefined4 **)(*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar13 * 8);
        if (ctx0[0x43] == (ggml_context)0x1) {
          uVar10 = ggml_row_size(*puVar5,uVar16);
          uVar11 = ggml_row_size(**(undefined4 **)
                                   (*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar13 * 8),
                                 uVar16 * uVar15);
          uVar10 = ggml_view_2d(gf,puVar5,uVar16,iVar14,uVar10,uVar11);
          puVar5 = *(undefined4 **)(*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar13 * 8);
          uVar11 = ggml_row_size(*puVar5,uVar16);
          uVar12 = ggml_row_size(**(undefined4 **)
                                   (*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar13 * 8),
                                 uVar16 * uVar17);
          uVar11 = ggml_view_2d(gf,puVar5,uVar16,iVar14,uVar11,uVar12);
        }
        else {
          uVar10 = ggml_row_size(*puVar5,*(undefined4 *)(*(long *)(ctx0 + 0x220) + 0x6c));
          uVar11 = ggml_row_size(**(undefined4 **)
                                   (*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar13 * 8),uVar15);
          uVar10 = ggml_view_2d(gf,puVar5,iVar14,uVar16,uVar10,uVar11);
          puVar5 = *(undefined4 **)(*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar13 * 8);
          uVar11 = ggml_row_size(*puVar5,*(undefined4 *)(*(long *)(ctx0 + 0x220) + 0x6c));
          uVar12 = ggml_row_size(**(undefined4 **)
                                   (*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar13 * 8),uVar17);
          uVar11 = ggml_view_2d(gf,puVar5,iVar14,uVar16,uVar11,uVar12);
        }
        uVar8 = ggml_cpy(gf,uVar8,uVar9);
        ggml_build_forward_expand(in_RCX,uVar8);
        uVar8 = ggml_cpy(gf,uVar10,uVar11);
        ggml_build_forward_expand(in_RCX,uVar8);
      }
    }
    uVar15 = (ulong)((int)local_88 + 1);
  }
  this->model = local_68;
  return (__uniq_ptr_data<llm_graph_result_i,_std::default_delete<llm_graph_result_i>,_true,_true>)
         (__uniq_ptr_data<llm_graph_result_i,_std::default_delete<llm_graph_result_i>,_true,_true>)
         this;
}

Assistant:

llm_graph_result_ptr llama_context::build_kv_self_defrag(
        ggml_context * ctx0,
        ggml_cgraph * gf) const {
    auto res = std::make_unique<llm_graph_result>();

    const auto & hparams = model.hparams;

    const auto & ids = kv_self->defrag_info.ids;

#if 0
    // CPU defrag
    //
    // TODO: optimizations are possible:
    //       - multiple threads
    //       - avoid copying to the host memory when already there
    //
    // likely not worth the effort, as we have ggml_graph based defrag
    //

    const uint32_t n_embd_k_gqa = hparams.n_embd_k_gqa();
    const uint32_t n_embd_v_gqa = hparams.n_embd_v_gqa();

    const uint32_t kv_size = size;

    std::vector<uint8_t> buf_k;
    std::vector<uint8_t> buf_v;

    for (uint32_t il = 0; il < n_layer; ++il) {
        const size_t k_size_row = ggml_row_size(k_l[il]->type, n_embd_k_gqa);
        const size_t k_size     = ggml_row_size(k_l[il]->type, n_embd_k_gqa*kv_size);

        const size_t v_size_el = ggml_type_size(v_l[il]->type);
        const size_t v_size    = ggml_row_size (v_l[il]->type, n_embd_v_gqa*kv_size);

        buf_k.resize(k_size);
        buf_v.resize(v_size);

        ggml_backend_tensor_get(k_l[il], buf_k.data(), 0, buf_k.size());
        ggml_backend_tensor_get(v_l[il], buf_v.data(), 0, buf_v.size());

        // batch move [i, i+nm) to [id, id+nm)
        // note: cells can move only to a lower index
        for (uint32_t i = 0; i < n_kv; ++i) {
            const uint32_t id = ids[i];

            if (i == id || id == n_kv) {
                continue;
            }

            uint32_t nm = 1;

            while (i + nm < n_kv && ids[i + nm] == id + nm) {
                nm++;
            }

            // move keys
            {
                const int64_t os =  i*k_size_row;
                const int64_t od = id*k_size_row;

                memcpy(buf_k.data() + od, buf_k.data() + os, nm*k_size_row);
            }

            // move values (note: they are transposed)
            {
                const int64_t os =  i;
                const int64_t od = id;

                for (uint32_t j = 0; j < n_embd_v_gqa; ++j) {
                    memcpy(buf_v.data() + (od + j*kv_size)*v_size_el, buf_v.data() + (os + j*kv_size)*v_size_el, nm*v_size_el);
                }
            }

            i += nm - 1;
        }

        ggml_backend_tensor_set(k_l[il], buf_k.data(), 0, buf_k.size());
        ggml_backend_tensor_set(v_l[il], buf_v.data(), 0, buf_v.size());
    }
#else
    for (uint32_t i = 0; i < ids.size(); ++i) {
        const uint32_t id = ids[i];

        if (i == id || id == ids.size()) {
            continue;
        }

        uint32_t nm = 1;

        while (i + nm < ids.size() && ids[i + nm] == id + nm) {
            nm++;
        }

        for (uint32_t il = 0; il < hparams.n_layer; ++il) { // NOLINT
            const int64_t n_embd_k_gqa = hparams.n_embd_k_gqa(il);
            const int64_t n_embd_v_gqa = hparams.n_embd_v_gqa(il);

            ggml_tensor * view_k_src = ggml_view_2d(ctx0, kv_self->k_l[il],
                    n_embd_k_gqa, nm,
                    ggml_row_size(kv_self->k_l[il]->type, n_embd_k_gqa),
                    ggml_row_size(kv_self->k_l[il]->type, n_embd_k_gqa*i));

            ggml_tensor * view_k_dst = ggml_view_2d(ctx0, kv_self->k_l[il],
                    n_embd_k_gqa, nm,
                    ggml_row_size(kv_self->k_l[il]->type, n_embd_k_gqa),
                    ggml_row_size(kv_self->k_l[il]->type, n_embd_k_gqa*id));

            ggml_tensor * view_v_src;
            ggml_tensor * view_v_dst;

            if (cparams.flash_attn) {
                // NOTE: the V cache is not transposed when using flash attention
                view_v_src = ggml_view_2d(ctx0, kv_self->v_l[il],
                        n_embd_v_gqa, nm,
                        ggml_row_size(kv_self->v_l[il]->type, n_embd_v_gqa),
                        ggml_row_size(kv_self->v_l[il]->type, n_embd_v_gqa*i));

                view_v_dst = ggml_view_2d(ctx0, kv_self->v_l[il],
                        n_embd_v_gqa, nm,
                        ggml_row_size(kv_self->v_l[il]->type, n_embd_v_gqa),
                        ggml_row_size(kv_self->v_l[il]->type, n_embd_v_gqa*id));
            } else {
                view_v_src = ggml_view_2d(ctx0, kv_self->v_l[il],
                        nm, n_embd_v_gqa,
                        ggml_row_size(kv_self->v_l[il]->type, kv_self->size),
                        ggml_row_size(kv_self->v_l[il]->type, i));

                view_v_dst = ggml_view_2d(ctx0, kv_self->v_l[il],
                        nm, n_embd_v_gqa,
                        ggml_row_size(kv_self->v_l[il]->type, kv_self->size),
                        ggml_row_size(kv_self->v_l[il]->type, id));
            }

            ggml_build_forward_expand(gf, ggml_cpy(ctx0, view_k_src, view_k_dst));
            ggml_build_forward_expand(gf, ggml_cpy(ctx0, view_v_src, view_v_dst));
        }

        i += nm - 1;
    }

    //LLAMA_LOG_INFO("gf->n_nodes = %d\n", gf->n_nodes);
#endif

    return res;
}